

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,Module *wasm,PassOptions *options)

{
  size_t sVar1;
  long lVar2;
  PassOptions *pPVar3;
  PassRunner *pPVar4;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_28;
  __alloc_node_gen_t __alloc_node_gen;
  
  *(code **)this = std::_Rb_tree_increment;
  *(Module **)(this + 8) = wasm;
  *(MixedArena **)(this + 0x10) = &wasm->allocator;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  pPVar3 = options;
  pPVar4 = this + 0x30;
  for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pPVar4 = *(undefined8 *)pPVar3;
    pPVar3 = (PassOptions *)&pPVar3->shrinkLevel;
    pPVar4 = pPVar4 + 8;
  }
  this[0x70] = (PassRunner)options->targetJS;
  local_28._M_h = (__hashtable_alloc *)(this + 0x78);
  *(undefined8 *)(this + 0x78) = 0;
  *(size_type *)(this + 0x80) = (options->arguments)._M_h._M_bucket_count;
  *(undefined8 *)(this + 0x88) = 0;
  *(size_type *)(this + 0x90) = (options->arguments)._M_h._M_element_count;
  sVar1 = (options->arguments)._M_h._M_rehash_policy._M_next_resize;
  *(undefined8 *)(this + 0x98) = *(undefined8 *)&(options->arguments)._M_h._M_rehash_policy;
  *(size_t *)(this + 0xa0) = sVar1;
  *(undefined8 *)(this + 0xa8) = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,&(options->arguments)._M_h,&local_28);
  local_28._M_h = (__hashtable_alloc *)(this + 0xb0);
  *(undefined8 *)(this + 0xb0) = 0;
  *(size_type *)(this + 0xb8) = (options->passesToSkip)._M_h._M_bucket_count;
  *(undefined8 *)(this + 0xc0) = 0;
  *(size_type *)(this + 200) = (options->passesToSkip)._M_h._M_element_count;
  sVar1 = (options->passesToSkip)._M_h._M_rehash_policy._M_next_resize;
  *(undefined8 *)(this + 0xd0) = *(undefined8 *)&(options->passesToSkip)._M_h._M_rehash_policy;
  *(size_t *)(this + 0xd8) = sVar1;
  *(undefined8 *)(this + 0xe0) = 0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_28._M_h,&(options->passesToSkip)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_28);
  *(undefined2 *)(this + 0xe8) = 0;
  return;
}

Assistant:

PassRunner(Module* wasm, PassOptions options)
    : wasm(wasm), allocator(&wasm->allocator), options(options) {}